

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O1

void * libpd_openfile(char *name,char *dir)

{
  t_symbol *name_00;
  t_symbol *dir_00;
  t_pd *pp_Var1;
  
  sys_lock();
  pd_globallock();
  name_00 = gensym(name);
  dir_00 = gensym(dir);
  pp_Var1 = glob_evalfile((t_pd *)0x0,name_00,dir_00);
  pd_globalunlock();
  sys_unlock();
  return pp_Var1;
}

Assistant:

void *libpd_openfile(const char *name, const char *dir) {
  void *retval;
  sys_lock();
  pd_globallock();
  retval = (void *)glob_evalfile(NULL, gensym(name), gensym(dir));
  pd_globalunlock();
  sys_unlock();
  return retval;
}